

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall
TPZTensor<TFad<6,_double>_>::TPZDecomposed::ComputeJ3(TPZDecomposed *this,TFad<6,_double> *J3)

{
  TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>_>_>
  local_280;
  TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_> local_270;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_260;
  undefined ***local_250;
  undefined ***local_248;
  undefined1 local_240 [24];
  TFad<6,_double> *local_228;
  TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_> local_220;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_210;
  TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
  local_200;
  undefined **local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  TFad<6,_double> local_1b0;
  TFad<6,_double> local_170;
  TFad<6,_double> local_130;
  TFad<6,_double> local_f0;
  TFad<6,_double> local_b0;
  TFad<6,_double> local_70;
  
  local_170.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
  local_170.val_ = 0.0;
  local_170.dx_[0] = 0.0;
  local_170.dx_[1] = 0.0;
  local_170.dx_[2] = 0.0;
  local_170.dx_[3] = 0.0;
  local_170.dx_[4] = 0.0;
  local_170.dx_[5] = 0.0;
  local_70.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
  local_70.val_ = 0.0;
  local_70.dx_[0] = 0.0;
  local_70.dx_[1] = 0.0;
  local_70.dx_[2] = 0.0;
  local_70.dx_[3] = 0.0;
  local_70.dx_[4] = 0.0;
  local_70.dx_[5] = 0.0;
  local_b0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
  local_b0.val_ = 0.0;
  local_b0.dx_[0] = 0.0;
  local_b0.dx_[1] = 0.0;
  local_b0.dx_[2] = 0.0;
  local_b0.dx_[3] = 0.0;
  local_b0.dx_[4] = 0.0;
  local_b0.dx_[5] = 0.0;
  local_1b0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
  local_1b0.val_ = 0.0;
  local_1b0.dx_[0] = 0.0;
  local_1b0.dx_[1] = 0.0;
  local_1b0.dx_[2] = 0.0;
  local_1b0.dx_[3] = 0.0;
  local_1b0.dx_[4] = 0.0;
  local_1b0.dx_[5] = 0.0;
  local_1f0 = &PTR__TFad_0166af08;
  local_1e8 = 0;
  uStack_1e0 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1b8 = 0;
  local_f0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
  local_f0.val_ = 0.0;
  local_f0.dx_[0] = 0.0;
  local_f0.dx_[1] = 0.0;
  local_f0.dx_[2] = 0.0;
  local_f0.dx_[3] = 0.0;
  local_f0.dx_[4] = 0.0;
  local_f0.dx_[5] = 0.0;
  local_130.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
  local_130.val_ = 0.0;
  local_130.dx_[0] = 0.0;
  local_130.dx_[1] = 0.0;
  local_130.dx_[2] = 0.0;
  local_130.dx_[3] = 0.0;
  local_130.dx_[4] = 0.0;
  local_130.dx_[5] = 0.0;
  TFad<6,_double>::operator=(&local_170,(this->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore);
  TFad<6,_double>::operator=
            (&local_70,(this->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore + 1);
  TFad<6,_double>::operator=
            (&local_b0,(this->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore + 2);
  local_200.fadexpr_.left_.constant_ = 0.3333333333333333;
  local_280.fadexpr_.left_.constant_ = (double)&local_170;
  local_280.fadexpr_.right_ =
       (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
        *)&local_200;
  local_220.fadexpr_.left_ = &local_170;
  local_220.fadexpr_.right_ = &local_70;
  local_210.fadexpr_.left_ = &local_220;
  local_210.fadexpr_.right_ = &local_b0;
  local_200.fadexpr_.right_ = &local_210;
  TFad<6,double>::operator=
            ((TFad<6,double> *)&local_1b0,
             (TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>_>_>
              *)&local_280);
  local_220.fadexpr_.left_ = &local_170;
  local_200.fadexpr_.left_.constant_ = 0.3333333333333333;
  local_280.fadexpr_.left_.constant_ = (double)&local_70;
  local_280.fadexpr_.right_ =
       (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
        *)&local_200;
  local_220.fadexpr_.right_ = &local_70;
  local_210.fadexpr_.left_ = &local_220;
  local_210.fadexpr_.right_ = &local_b0;
  local_200.fadexpr_.right_ = &local_210;
  TFad<6,double>::operator=
            ((TFad<6,double> *)&local_1f0,
             (TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>_>_>
              *)&local_280);
  local_220.fadexpr_.left_ = &local_170;
  local_200.fadexpr_.left_.constant_ = 0.3333333333333333;
  local_280.fadexpr_.left_.constant_ = (double)&local_b0;
  local_280.fadexpr_.right_ =
       (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
        *)&local_200;
  local_220.fadexpr_.right_ = &local_70;
  local_210.fadexpr_.left_ = &local_220;
  local_210.fadexpr_.right_ = &local_b0;
  local_200.fadexpr_.right_ = &local_210;
  TFad<6,double>::operator=
            ((TFad<6,double> *)&local_f0,
             (TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>_>_>
              *)&local_280);
  local_220.fadexpr_.left_ = (TFad<6,_double> *)(local_240 + 0x10);
  local_240._16_8_ = &local_1b0;
  local_240._0_8_ = &local_250;
  local_250 = &local_1f0;
  local_210.fadexpr_.right_ = (TFad<6,_double> *)local_240;
  local_260.fadexpr_.left_ = &local_270;
  local_200.fadexpr_.right_ = &local_260;
  local_280.fadexpr_.left_.constant_ = 0.3333333333333333;
  local_280.fadexpr_.right_ =
       (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
        *)&local_200;
  local_270.fadexpr_.left_ = &local_f0;
  local_270.fadexpr_.right_ = &local_f0;
  local_260.fadexpr_.right_ = &local_f0;
  local_248 = local_250;
  local_240._8_8_ = local_250;
  local_228 = (TFad<6,_double> *)local_240._16_8_;
  local_220.fadexpr_.right_ = (TFad<6,_double> *)local_240._16_8_;
  local_210.fadexpr_.left_ = &local_220;
  local_200.fadexpr_.left_.constant_ = (double)&local_210;
  TFad<6,double>::operator=((TFad<6,double> *)&local_130,&local_280);
  TFad<6,_double>::operator=(J3,&local_130);
  return;
}

Assistant:

void ComputeJ3(T & J3) {
            T sig1, sig2, sig3, s1, s2, s3, temp;
            sig1 = this->fEigenvalues[0];
            sig2 = this->fEigenvalues[1];
            sig3 = this->fEigenvalues[2];
            s1 = sig1 - (1. / 3.)*(sig1 + sig2 + sig3);
            s2 = sig2 - (1. / 3.)*(sig1 + sig2 + sig3);
            s3 = sig3 - (1. / 3.)*(sig1 + sig2 + sig3);
            temp = (1. / 3.)*(s1 * s1 * s1 + s2 * s2 * s2 + s3 * s3 * s3);
            J3 = temp;
        }